

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPacketListener.h
# Opt level: O0

void __thiscall
osc::OscPacketListener::ProcessPacket
          (OscPacketListener *this,char *data,int size,IpEndpointName *remoteEndpoint)

{
  bool bVar1;
  ReceivedMessage local_70;
  ReceivedBundle local_50;
  undefined1 local_38 [8];
  ReceivedPacket p;
  IpEndpointName *remoteEndpoint_local;
  int size_local;
  char *data_local;
  OscPacketListener *this_local;
  
  p._8_8_ = remoteEndpoint;
  ReceivedPacket::ReceivedPacket((ReceivedPacket *)local_38,data,size);
  bVar1 = ReceivedPacket::IsBundle((ReceivedPacket *)local_38);
  if (bVar1) {
    ReceivedBundle::ReceivedBundle(&local_50,(ReceivedPacket *)local_38);
    (*(this->super_PacketListener)._vptr_PacketListener[3])(this,&local_50,p._8_8_);
  }
  else {
    ReceivedMessage::ReceivedMessage(&local_70,(ReceivedPacket *)local_38);
    (*(this->super_PacketListener)._vptr_PacketListener[4])(this,&local_70,p._8_8_);
  }
  return;
}

Assistant:

virtual void ProcessPacket( const char *data, int size, 
			const IpEndpointName& remoteEndpoint )
    {
        osc::ReceivedPacket p( data, size );
        if( p.IsBundle() )
            ProcessBundle( ReceivedBundle(p), remoteEndpoint );
        else
            ProcessMessage( ReceivedMessage(p), remoteEndpoint );
    }